

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

boolean lib_dlb_fopen(dlb *dp,char *name,char *mode)

{
  boolean bVar1;
  library *local_40;
  library *lp;
  long size;
  long start;
  char *mode_local;
  char *name_local;
  dlb *dp_local;
  
  start = (long)mode;
  mode_local = name;
  name_local = (char *)dp;
  bVar1 = find_file(name,&local_40,&size,(long *)&lp);
  if (bVar1 != '\0') {
    *(library **)(name_local + 8) = local_40;
    *(long *)(name_local + 0x10) = size;
    *(library **)(name_local + 0x18) = lp;
    name_local[0x20] = '\0';
    name_local[0x21] = '\0';
    name_local[0x22] = '\0';
    name_local[0x23] = '\0';
    name_local[0x24] = '\0';
    name_local[0x25] = '\0';
    name_local[0x26] = '\0';
    name_local[0x27] = '\0';
  }
  return bVar1 != '\0';
}

Assistant:

static boolean lib_dlb_fopen(dlb *dp, const char *name, const char *mode)
{
    long start, size;
    library *lp;

    /* look up file in directory */
    if (find_file(name, &lp, &start, &size)) {
	dp->lib = lp;
	dp->start = start;
	dp->size = size;
	dp->mark = 0;
	return TRUE;
	}

    return FALSE;	/* failed */
}